

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

AsmJsType __thiscall Js::AsmJsArrayView::GetType(AsmJsArrayView *this)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  AsmJsArrayView *this_local;
  
  bVar1 = (this->super_AsmJsSymbol).field_0x14;
  if (bVar1 < 6) {
    AsmJsType::AsmJsType((AsmJsType *)((long)&this_local + 4),Intish);
  }
  else if (bVar1 == 6) {
    AsmJsType::AsmJsType((AsmJsType *)((long)&this_local + 4),MaybeFloat);
  }
  else if (bVar1 == 7) {
    AsmJsType::AsmJsType((AsmJsType *)((long)&this_local + 4),MaybeDouble);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x399,"(false)","Unexpected array type");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    AsmJsType::AsmJsType((AsmJsType *)((long)&this_local + 4),Intish);
  }
  return (AsmJsType)this_local._4_4_;
}

Assistant:

Js::AsmJsType AsmJsArrayView::GetType() const
    {
        switch (mViewType)
        {
        case ArrayBufferView::TYPE_INT8:
        case ArrayBufferView::TYPE_INT16:
        case ArrayBufferView::TYPE_INT32:
        case ArrayBufferView::TYPE_UINT8:
        case ArrayBufferView::TYPE_UINT16:
        case ArrayBufferView::TYPE_UINT32:
            return AsmJsType::Intish;
        case ArrayBufferView::TYPE_FLOAT32:
            return AsmJsType::MaybeFloat;
        case ArrayBufferView::TYPE_FLOAT64:
            return AsmJsType::MaybeDouble;
        default:;
        }
        AssertMsg(false, "Unexpected array type");
        return AsmJsType::Intish;
    }